

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O3

DESCRIPTOR_DATA * new_descriptor(void)

{
  DESCRIPTOR_DATA *__s;
  
  if (descriptor_free == (DESCRIPTOR_DATA *)0x0) {
    __s = (DESCRIPTOR_DATA *)operator_new(0x6c78);
  }
  else {
    __s = descriptor_free;
    descriptor_free = descriptor_free->next;
  }
  memset(__s,0,0x6c78);
  __s->valid = true;
  return __s;
}

Assistant:

DESCRIPTOR_DATA *new_descriptor(void)
{
	static DESCRIPTOR_DATA d_zero;
	DESCRIPTOR_DATA *d;

	if (descriptor_free == nullptr)
		d = new DESCRIPTOR_DATA;
	else
	{
		d = descriptor_free;
		descriptor_free = descriptor_free->next;
	}

	*d = d_zero;

	d->valid = true;
	return d;
}